

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaV_concat(lua_State *L,int total,int last)

{
  StkId pTVar1;
  Table *pTVar2;
  global_State *pgVar3;
  int iVar4;
  char *pcVar5;
  GCObject *pGVar6;
  StkId pTVar7;
  Table *pTVar8;
  size_t l;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  TValue *p1;
  
  do {
    pTVar1 = L->base;
    pTVar7 = pTVar1 + last;
    p1 = pTVar1 + (long)last + -1;
    if ((pTVar1[(long)last + -1].tt - 3U < 2) &&
       ((pTVar7->tt == 4 || (iVar4 = luaV_tostring(L,pTVar7), iVar4 != 0)))) {
      pTVar8 = (((pTVar7->value).gc)->h).metatable;
      if (pTVar8 == (Table *)0x0) {
        iVar9 = 1;
        if (pTVar7[-1].tt != 4) {
          luaV_tostring(L,p1);
        }
      }
      else {
        uVar11 = 1;
        if (1 < total) {
          uVar10 = 1;
          do {
            if ((p1->tt != 4) && (iVar4 = luaV_tostring(L,p1), uVar11 = uVar10, iVar4 == 0)) break;
            pTVar2 = (((p1->value).gc)->h).metatable;
            if ((Table *)(-(long)pTVar8 - 3U) <= pTVar2) {
              pcVar5 = "string length overflow";
              goto LAB_00104f33;
            }
            pTVar8 = (Table *)((long)&pTVar2->next + (long)&pTVar8->next);
            uVar10 = uVar10 + 1;
            p1 = p1 + -1;
            uVar11 = (ulong)(uint)total;
          } while ((uint)total != uVar10);
        }
        pgVar3 = L->l_G;
        pTVar2 = (Table *)(pgVar3->buff).buffsize;
        if (pTVar2 < pTVar8) {
          if (pTVar8 < (Table *)0x21) {
            pTVar8 = (Table *)0x20;
          }
          if ((undefined1 *)0xfffffffffffffffd < (undefined1 *)((long)&pTVar8->next + 1)) {
            pcVar5 = "memory allocation error: block too big";
LAB_00104f33:
            luaG_runerror(L,pcVar5);
          }
          pcVar5 = (char *)luaM_realloc_(L,(pgVar3->buff).buffer,(size_t)pTVar2,(size_t)pTVar8);
          (pgVar3->buff).buffer = pcVar5;
          (pgVar3->buff).buffsize = (size_t)pTVar8;
        }
        pcVar5 = (pgVar3->buff).buffer;
        iVar4 = (int)uVar11 + 1;
        pTVar7 = pTVar1 + ((long)last - (uVar11 & 0xffffffff));
        l = 0;
        do {
          pTVar7 = pTVar7 + 1;
          pTVar8 = (((pTVar7->value).gc)->h).metatable;
          memcpy(pcVar5 + l,&(((pTVar7->value).gc)->h).array,(size_t)pTVar8);
          l = (long)&pTVar8->next + l;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
        pGVar6 = (GCObject *)luaS_newlstr(L,pcVar5,l);
        pTVar1[(long)last + (1 - (uVar11 & 0xffffffff))].value.gc = pGVar6;
        pTVar1[(long)last + (1 - (uVar11 & 0xffffffff))].tt = 4;
        iVar9 = (int)uVar11 + -1;
      }
    }
    else {
      iVar4 = call_binTM(L,p1,pTVar7,p1,TM_CONCAT);
      iVar9 = 1;
      if (iVar4 == 0) {
        if (pTVar7[-1].tt - 3U < 2) {
          p1 = pTVar7;
        }
        luaG_runerror(L,"attempt to %s a %s value","concatenate",luaT_typenames[p1->tt]);
      }
    }
    total = total - iVar9;
    last = last - iVar9;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

static void luaV_concat(lua_State*L,int total,int last){
do{
StkId top=L->base+last+1;
int n=2;
if(!(ttisstring(top-2)||ttisnumber(top-2))||!tostring(L,top-1)){
if(!call_binTM(L,top-2,top-1,top-2,TM_CONCAT))
luaG_concaterror(L,top-2,top-1);
}else if(tsvalue(top-1)->len==0)
(void)tostring(L,top-2);
else{
size_t tl=tsvalue(top-1)->len;
char*buffer;
int i;
for(n=1;n<total&&tostring(L,top-n-1);n++){
size_t l=tsvalue(top-n-1)->len;
if(l>=((size_t)(~(size_t)0)-2)-tl)luaG_runerror(L,"string length overflow");
tl+=l;
}
buffer=luaZ_openspace(L,&G(L)->buff,tl);
tl=0;
for(i=n;i>0;i--){
size_t l=tsvalue(top-i)->len;
memcpy(buffer+tl,svalue(top-i),l);
tl+=l;
}
setsvalue(L,top-n,luaS_newlstr(L,buffer,tl));
}
total-=n-1;
last-=n-1;
}while(total>1);
}